

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn)

{
  uint uVar1;
  u16 *puVar2;
  WhereTerm **ppWVar3;
  double dVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  WhereClause *pWVar9;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar10;
  WhereTerm *pWVar11;
  sqlite3_vtab *psVar12;
  i8 iVar13;
  LogEst LVar14;
  int iVar15;
  int iVar16;
  VTable *pVVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  uchar *puVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  
  pWVar9 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar10 = pBuilder->pWInfo->pTabList;
  bVar5 = pTemplate->iTab;
  uVar6 = pIdxInfo->nConstraint;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  uVar23 = 0;
  if (0 < (int)uVar6) {
    uVar23 = uVar6;
  }
  puVar21 = &pIdxInfo->aConstraint->usable;
  uVar22 = uVar23;
  while (bVar24 = uVar22 != 0, uVar22 = uVar22 - 1, bVar24) {
    pWVar11 = pWVar9->a;
    *puVar21 = '\0';
    if (((pWVar11[*(int *)(puVar21 + 3)].prereqRight & ~mUsable) == 0) &&
       ((pWVar11[*(int *)(puVar21 + 3)].eOperator & mExclude) == 0)) {
      *puVar21 = '\x01';
    }
    puVar21 = puVar21 + 0xc;
  }
  memset(__s,0,(long)(int)uVar6 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar10->a[bVar5].colUsed;
  pVVar17 = sqlite3GetVTable(pParse->db,pSVar10->a[bVar5].pTab);
  psVar12 = pVVar17->pVtab;
  iVar15 = (*psVar12->pModule->xBestIndex)(psVar12,pIdxInfo);
  if ((iVar15 != 0) && (iVar15 != 0x13)) {
    if (iVar15 == 7) {
      sqlite3OomFault(pParse->db);
      sqlite3_free(psVar12->zErrMsg);
      psVar12->zErrMsg = (char *)0x0;
      return 7;
    }
    pcVar18 = psVar12->zErrMsg;
    if (pcVar18 == (char *)0x0) {
      pcVar18 = sqlite3ErrStr(iVar15);
    }
    sqlite3ErrorMsg(pParse,"%s",pcVar18);
  }
  sqlite3_free(psVar12->zErrMsg);
  psVar12->zErrMsg = (char *)0x0;
  iVar16 = 0;
  if ((iVar15 != 0x13) && (iVar16 = iVar15, iVar15 == 0)) {
    for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
      pTemplate->aLTerm[uVar19] = (WhereTerm *)0x0;
    }
    (pTemplate->u).btree.nIdxCol = 0;
    puVar21 = &pIdxInfo->aConstraint->usable;
    uVar22 = 0xffffffff;
    for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
      uVar7 = __s[uVar19].argvIndex;
      if (0 < (int)uVar7) {
        if ((int)uVar6 < (int)uVar7) goto LAB_001613ff;
        uVar8 = *(uint *)(puVar21 + 3);
        if (((int)uVar8 < 0) || (pWVar9->nTerm <= (int)uVar8)) goto LAB_001613ff;
        uVar1 = uVar7 - 1;
        if ((pTemplate->aLTerm[uVar1] != (WhereTerm *)0x0) || (*puVar21 == '\0')) goto LAB_001613ff;
        pWVar11 = pWVar9->a + uVar8;
        pTemplate->prereq = pTemplate->prereq | pWVar9->a[uVar8].prereqRight;
        pTemplate->aLTerm[uVar1] = pWVar11;
        if ((int)uVar22 < (int)uVar1) {
          uVar22 = uVar1;
        }
        if ((uVar7 < 0x11) && (__s[uVar19].omit != '\0')) {
          puVar2 = &(pTemplate->u).btree.nIdxCol;
          *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar1 & 0x1f));
        }
        if ((pWVar11->eOperator & 1) != 0) {
          pIdxInfo->orderByConsumed = 0;
          *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
          *pbIn = 1;
        }
      }
      puVar21 = puVar21 + 0xc;
    }
    puVar2 = &(pTemplate->u).btree.nIdxCol;
    *puVar2 = *puVar2 & ~mNoOmit;
    pTemplate->nLTerm = (short)uVar22 + 1;
    lVar20 = 0;
    do {
      if ((int)uVar22 < lVar20) {
        (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
        (pTemplate->u).vtab.needFree = (u8)pIdxInfo->needToFreeIdxStr;
        pIdxInfo->needToFreeIdxStr = 0;
        (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
        if (pIdxInfo->orderByConsumed == 0) {
          iVar13 = '\0';
        }
        else {
          iVar13 = (i8)pIdxInfo->nOrderBy;
        }
        (pTemplate->u).vtab.isOrdered = iVar13;
        pTemplate->rSetup = 0;
        dVar4 = pIdxInfo->estimatedCost;
        if (dVar4 <= 1.0) {
          LVar14 = 0;
        }
        else if (dVar4 <= 2000000000.0) {
          LVar14 = sqlite3LogEst((long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f |
                                 (long)dVar4);
        }
        else {
          LVar14 = (ushort)((ulong)dVar4 >> 0x34) * 10 + -0x27ec;
        }
        pTemplate->rRun = LVar14;
        LVar14 = sqlite3LogEst(pIdxInfo->estimatedRows);
        pTemplate->nOut = LVar14;
        pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
        iVar15 = whereLoopInsert(pBuilder,pTemplate);
        if ((pTemplate->u).vtab.needFree == '\0') {
          return iVar15;
        }
        sqlite3_free((pTemplate->u).btree.pIndex);
        (pTemplate->u).vtab.needFree = '\0';
        return iVar15;
      }
      ppWVar3 = pTemplate->aLTerm + lVar20;
      lVar20 = lVar20 + 1;
    } while (*ppWVar3 != (WhereTerm *)0x0);
LAB_001613ff:
    sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar10->a[bVar5].pTab)->zName);
    iVar16 = 1;
  }
  return iVar16;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn                       /* OUT: True if plan uses an IN(...) op */
){
  WhereClause *pWC = pBuilder->pWC;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  struct SrcList_item *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by 
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight 
     && (pTerm->eOperator & mExclude)==0
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  for(i=0; i<nConstraint; i++) pNew->aLTerm[i] = 0;
  pNew->u.vtab.omitMask = 0;
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( iTerm<16 && pUsage[i].omit ) pNew->u.vtab.omitMask |= 1<<iTerm;
      if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }
    }
  }
  pNew->u.vtab.omitMask &= ~mNoOmit;

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}